

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O2

bool cmTargetPropertyComputer::PassesWhitelist
               (TargetType tgtType,string *prop,cmMessenger *messenger,cmListFileBacktrace *context)

{
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  string local_1c0;
  ostringstream e;
  
  bVar3 = true;
  if (tgtType == INTERFACE_LIBRARY) {
    bVar1 = WhiteListedInterfaceProperty(prop);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar2 = std::operator<<((ostream *)&e,
                               "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                              );
      poVar2 = std::operator<<(poVar2,(string *)prop);
      std::operator<<(poVar2,"\" is not allowed.");
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage(messenger,FATAL_ERROR,&local_1c0,context);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool cmTargetPropertyComputer::PassesWhitelist(
  cmStateEnums::TargetType tgtType, std::string const& prop,
  cmMessenger* messenger, cmListFileBacktrace const& context)
{
  if (tgtType == cmStateEnums::INTERFACE_LIBRARY &&
      !WhiteListedInterfaceProperty(prop)) {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \""
      << prop << "\" is not allowed.";
    messenger->IssueMessage(MessageType::FATAL_ERROR, e.str(), context);
    return false;
  }
  return true;
}